

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilEnum.c
# Opt level: O1

void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *p,int fNew,int iNode1st)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  word *pwVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  int local_8c;
  int local_88;
  uint local_80;
  
  do {
    iVar2 = p->nNodes;
    iVar10 = p->nNodeMax - iVar2;
    if (iVar10 == 0) {
      if (p->nTops == 1) {
        if (p->fVerbose != 0) {
          Kit_DsdPrintFromTruth((uint *)(p->pTruths + (long)iVar2 + -1),p->nVars);
          iVar2 = p->nVars;
          lVar17 = (long)iVar2;
          if (iVar2 < p->nNodes) {
            uVar20 = iVar2 + 0x61;
            do {
              if (p->Polar[lVar17] == 4) {
                printf("  %c=%c+%c",(ulong)uVar20,(ulong)(p->pFans0[lVar17] + 0x61),
                       (ulong)(p->pFans1[lVar17] + 0x61));
              }
              else {
                pcVar11 = "!";
                if (p->fCompl0[lVar17] == 0) {
                  pcVar11 = "";
                }
                pcVar15 = "!";
                if (p->fCompl1[lVar17] == 0) {
                  pcVar15 = "";
                }
                printf("  %c=%s%c%s%c",(ulong)uVar20,pcVar11,(ulong)(p->pFans0[lVar17] + 0x61),
                       pcVar15,(ulong)(p->pFans1[lVar17] + 0x61));
              }
              lVar17 = lVar17 + 1;
              uVar20 = uVar20 + 1;
            } while (lVar17 < p->nNodes);
          }
          putchar(10);
        }
        p->nFinished = p->nFinished + 1;
        return;
      }
      __assert_fail("p->nTops == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                    ,0x23b,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
    }
    iVar7 = iNode1st;
    local_8c = iVar2;
    if (fNew == 0) {
      iVar7 = p->pFans0[(long)iVar2 + 0xf];
      local_8c = iNode1st;
    }
    local_88 = 0;
    if (fNew == 0) {
      local_88 = p->pFans0[(long)iVar2 + -1];
    }
    local_80 = 1;
    if (fNew == 0) {
      local_80 = p->fCompl1[(long)iVar2 + 0xf] + 1;
    }
    iVar13 = p->nTops;
    if ((iVar13 < 1) || (iVar10 + 1 < iVar13)) {
      __assert_fail("p->nTops > 0 && p->nTops <= p->nNodeMax - n + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                    ,0x249,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
    }
    if (iVar7 < local_8c) {
      uVar20 = p->fUseXor + 4;
      iVar13 = (p->nNodeMax - (iVar13 + iVar2)) + 1;
      lVar8 = (long)iVar7;
      iVar10 = p->pLevel[lVar8];
      lVar17 = lVar8;
      do {
        if ((iVar13 != 0) || (iVar7 = 0, p->pRefs[lVar17] < 1)) {
          iVar13 = iVar13 - (uint)(0 < p->pRefs[lVar17]);
          if (iVar13 < 0) {
            __assert_fail("nRefedFans >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                          ,0x251,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
          }
          iVar7 = local_88;
          if (lVar17 != lVar8) {
            iVar7 = 0;
          }
          for (lVar19 = (long)iVar7; lVar19 < lVar17; lVar19 = lVar19 + 1) {
            if ((iVar13 != 0) || (p->pRefs[lVar19] < 1)) {
              if ((((iVar10 != 0) || ((p->pRefs[lVar19] != 0 || (p->pRefs[lVar17] != 0)))) ||
                  (((int)lVar19 + 1 == (int)lVar17 &&
                   ((lVar19 < 1 || (p->Polar[lVar19 + 0xf] != 0)))))) &&
                 ((p->pLevel[lVar17] != 0 ||
                  ((((p->pRefs[lVar17] != 0 || (lVar17 < 1)) || (p->pRefs[lVar19] == 0)) ||
                   (p->Polar[lVar17 + 0xf] != 0)))))) {
                uVar21 = local_80;
                if (lVar19 != local_88) {
                  uVar21 = 0;
                }
                uVar22 = (ulong)uVar21;
                if (fNew != 0) {
                  uVar22 = 0;
                }
                if (lVar17 != lVar8) {
                  uVar22 = 0;
                }
                if ((int)uVar22 < (int)uVar20) {
                  do {
                    uVar21 = (uint)uVar22;
                    if ((((p->pLevel[lVar19] != 0) || ((uVar22 & 1) == 0)) ||
                        (p->pRefs[lVar19] != 0)) &&
                       (((p->pLevel[lVar17] != 0 || ((uVar22 & 2) == 0)) || (p->pRefs[lVar17] != 0))
                       )) {
                      p->nTries = p->nTries + 1;
                      p->pFans0[iVar2] = (int)lVar19;
                      p->pFans1[iVar2] = (int)lVar17;
                      p->fCompl0[iVar2] = uVar21 & 1;
                      p->fCompl1[iVar2] = (uint)(uVar22 >> 1) & 1;
                      p->Polar[iVar2] = uVar21;
                      if (uVar21 == 4) {
                        p->pTruths[iVar2] = p->pTruths[lVar17] ^ p->pTruths[lVar19];
                      }
                      else {
                        if ((uVar22 & 1) == 0) {
                          uVar9 = p->pTruths[lVar19];
                        }
                        else {
                          uVar9 = ~p->pTruths[lVar19];
                        }
                        if ((uVar22 & 2) == 0) {
                          uVar22 = p->pTruths[lVar17];
                        }
                        else {
                          uVar22 = ~p->pTruths[lVar17];
                        }
                        p->pTruths[iVar2] = uVar22 & uVar9;
                      }
                      lVar12 = (long)p->nNodes;
                      uVar3 = p->pFans0[lVar12];
                      uVar4 = p->pFans1[lVar12];
                      uVar22 = (ulong)uVar4;
                      if ((int)uVar4 <= (int)uVar3) {
                        __assert_fail("i < k",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                      ,0x20b,"int Abc_EnumerateFilter(Abc_EnuMan_t *)");
                      }
                      uVar9 = p->pTruths[lVar12];
                      if (uVar9 - 1 < 0xfffffffffffffffe) {
                        if (0 < p->nNodes) {
                          lVar14 = 0;
                          do {
                            if ((uVar9 == p->pTruths[lVar14]) ||
                               ((p->pTruths[lVar14] ^ uVar9) == 0xffffffffffffffff))
                            goto LAB_00414f56;
                            lVar14 = lVar14 + 1;
                          } while (lVar12 != lVar14);
                        }
                        bVar23 = -1 < (int)uVar3;
                        if (bVar23) {
                          bVar23 = true;
                          uVar18 = 0;
                          pwVar16 = p->pTruths;
                          do {
                            pwVar16 = pwVar16 + 1;
                            if ((long)uVar18 < (long)(int)uVar4) {
                              lVar12 = 0;
                              do {
                                if ((uVar18 != uVar3) || (uVar22 - 1 != lVar12)) {
                                  uVar5 = p->pTruths[uVar18];
                                  uVar6 = pwVar16[lVar12];
                                  if (((((uVar9 == (uVar6 & uVar5)) ||
                                        ((((uVar6 & uVar5 ^ uVar9) == 0xffffffffffffffff ||
                                          (uVar9 == (~uVar6 & uVar5))) ||
                                         ((~uVar6 & uVar5 ^ uVar9) == 0xffffffffffffffff)))) ||
                                       (((uVar9 == (~uVar5 & uVar6) ||
                                         ((~uVar5 & uVar6 ^ uVar9) == 0xffffffffffffffff)) ||
                                        (uVar9 == (uVar6 | uVar5))))) ||
                                      (((uVar6 | uVar5) ^ uVar9) == 0xffffffffffffffff)) ||
                                     ((p->fUseXor != 0 &&
                                      ((uVar9 == (uVar6 ^ uVar5) ||
                                       ((uVar6 ^ uVar5 ^ uVar9) == 0xffffffffffffffff))))))
                                  goto LAB_00414e3e;
                                }
                                lVar12 = lVar12 + 1;
                              } while ((int)uVar22 != (int)lVar12);
                            }
                            bVar23 = uVar18 < uVar3;
                            uVar18 = uVar18 + 1;
                            uVar22 = uVar22 - 1;
                          } while (uVar18 != uVar3 + 1);
                        }
LAB_00414e3e:
                        if (!bVar23) {
                          p->nBuilds = p->nBuilds + 1;
                          iVar7 = p->pLevel[lVar17];
                          if (p->pLevel[lVar17] < p->pLevel[lVar19]) {
                            iVar7 = p->pLevel[lVar19];
                          }
                          if (iVar10 != iVar7) {
                            __assert_fail("Level == Abc_MaxInt(p->pLevel[i], p->pLevel[k])",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x273,
                                          "void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
                          }
                          p->pLevel[iVar2] = iVar10 + 1;
                          iVar7 = p->pRefs[p->pFans0[iVar2]];
                          if (iVar7 < 0) {
LAB_00415120:
                            __assert_fail("p->pRefs[i] >= 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x1ce,"void Abc_EnumRef(Abc_EnuMan_t *, int)");
                          }
                          p->pRefs[p->pFans0[iVar2]] = iVar7 + 1;
                          if (iVar7 == 0) {
                            p->nTops = p->nTops + -1;
                          }
                          iVar7 = p->pRefs[p->pFans1[iVar2]];
                          if (iVar7 < 0) goto LAB_00415120;
                          p->pRefs[p->pFans1[iVar2]] = iVar7 + 1;
                          if (iVar7 == 0) {
                            p->nTops = p->nTops + -1;
                          }
                          p->nTops = p->nTops + 1;
                          iVar7 = p->nNodes;
                          p->nNodes = iVar7 + 1;
                          if (iVar7 < iVar2) {
                            __assert_fail("i < p->nNodes",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x1de,"void Abc_EnumRefNode(Abc_EnuMan_t *, int)");
                          }
                          Abc_EnumerateFuncs_rec(p,0,local_8c);
                          if (p->nNodes <= iVar2) {
                            __assert_fail("i < p->nNodes",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x1e2,"void Abc_EnumDerefNode(Abc_EnuMan_t *, int)");
                          }
                          iVar7 = p->pFans0[iVar2];
                          piVar1 = p->pRefs + iVar7;
                          *piVar1 = *piVar1 + -1;
                          if (*piVar1 == 0) {
                            p->nTops = p->nTops + 1;
                          }
                          if (p->pRefs[iVar7] < 0) {
LAB_0041513f:
                            __assert_fail("p->pRefs[i] >= 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x1d6,"void Abc_EnumDeref(Abc_EnuMan_t *, int)");
                          }
                          iVar7 = p->pFans1[iVar2];
                          piVar1 = p->pRefs + iVar7;
                          *piVar1 = *piVar1 + -1;
                          if (*piVar1 == 0) {
                            p->nTops = p->nTops + 1;
                          }
                          if (p->pRefs[iVar7] < 0) goto LAB_0041513f;
                          p->nTops = p->nTops + -1;
                          iVar7 = p->nNodes + -1;
                          p->nNodes = iVar7;
                          if (iVar2 != iVar7) {
                            __assert_fail("n == p->nNodes",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x278,
                                          "void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
                          }
                        }
                      }
                    }
LAB_00414f56:
                    uVar22 = (ulong)(uVar21 + 1);
                  } while (uVar21 + 1 != uVar20);
                }
              }
            }
          }
          iVar7 = iVar13 + (uint)(0 < p->pRefs[lVar17]);
        }
        iVar13 = iVar7;
        lVar17 = lVar17 + 1;
      } while (local_8c != (int)lVar17);
    }
    bVar23 = fNew != 0;
    fNew = 1;
    if (bVar23) {
      return;
    }
  } while( true );
}

Assistant:

void Abc_EnumerateFuncs_rec( Abc_EnuMan_t * p, int fNew, int iNode1st ) // the first node on the last level
{
    if ( p->nNodes == p->nNodeMax )
    {
        assert( p->nTops == 1 );
        if ( p->fVerbose )
            Abc_EnumPrintOne( p );
        p->nFinished++;
        return;
    }
    {
    int i, k, c, cLim = 4 + p->fUseXor, n = p->nNodes;
    int nRefedFans = p->nNodeMax - n + 1 - p->nTops;
    int high0 = fNew ? iNode1st : p->pFans1[n-1];
    int high1 = fNew ? n        : iNode1st;
    int low0  = fNew ? 0        : p->pFans0[n-1];
    int c0    = fNew ? 0        : p->Polar[n-1];
    int Level = p->pLevel[high0];
    assert( p->nTops > 0 && p->nTops <= p->nNodeMax - n + 1 );
    // go through nodes 
    for ( k = high0; k < high1; k++ )
    {
        if ( nRefedFans == 0 && p->pRefs[k] > 0 )
            continue;
        if ( p->pRefs[k] > 0 )
            nRefedFans--;
        assert( nRefedFans >= 0 );
        // try second fanin
        for ( i = (k == high0) ? low0 : 0; i < k; i++ )
        {
            if ( nRefedFans == 0 && p->pRefs[i] > 0 )
                continue;
            if ( Level == 0 && p->pRefs[i] == 0 && p->pRefs[k] == 0 && (i+1 != k || (i > 0 && p->pRefs[i-1] == 0)) ) // NPN
                continue;
            if ( p->pLevel[k] == 0 && p->pRefs[k] == 0 && p->pRefs[i] != 0 && k > 0 && p->pRefs[k-1] == 0 ) // NPN
                continue;
//            if ( p->pLevel[i] == 0 && p->pRefs[i] == 0 && p->pRefs[k] != 0 && i > 0 && p->pRefs[i-1] == 0 ) // NPN
//                continue;
            // try four polarities
            for ( c = (k == high0 && i == low0 && !fNew) ? c0 + 1 : 0; c < cLim; c++ )
            {
                if ( p->pLevel[i] == 0 && p->pRefs[i] == 0 && (c & 1) == 1 ) // NPN
                    continue;
                if ( p->pLevel[k] == 0 && p->pRefs[k] == 0 && (c & 2) == 2 ) // NPN
                    continue;
                p->nTries++;
                // create node
                assert( i < k );
                p->pFans0[n]  = i;
                p->pFans1[n]  = k;
                p->fCompl0[n] = c & 1;
                p->fCompl1[n] = (c >> 1) & 1;
                p->Polar[n]   = c;
                if ( c == 4 )
                    p->pTruths[n] = p->pTruths[i] ^ p->pTruths[k];
                else
                    p->pTruths[n] = ((c & 1) ? ~p->pTruths[i] : p->pTruths[i]) & ((c & 2) ? ~p->pTruths[k] : p->pTruths[k]);
                if ( Abc_EnumerateFilter(p) )
                    continue;
                p->nBuilds++;
                assert( Level == Abc_MaxInt(p->pLevel[i], p->pLevel[k]) );
                p->pLevel[n]  = Level + 1;
                Abc_EnumRefNode( p, n );
                Abc_EnumerateFuncs_rec( p, 0, fNew ? n : iNode1st );
                Abc_EnumDerefNode( p, n );
                assert( n == p->nNodes );
            }
        }
        if ( p->pRefs[k] > 0 )
            nRefedFans++;
    }
    if ( fNew )
        return;
    // start a new level
    Abc_EnumerateFuncs_rec( p, 1, iNode1st );
    }
}